

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

double __thiscall
despot::PocmanSmartParticleUpperBound::Value(PocmanSmartParticleUpperBound *this,State *state)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = this->pocman_->reward_eat_food_;
  dVar2 = this->pocman_->reward_eat_ghost_;
  dVar4 = pow(___cxa_finalize,(double)*(int *)(state + 0x80));
  dVar6 = 1.0 - ___cxa_finalize;
  dVar3 = this->pocman_->reward_clear_level_;
  dVar5 = pow(___cxa_finalize,(double)*(int *)(state + 0x80));
  return dVar5 * dVar3 + ((1.0 - dVar4) * (dVar1 + dVar2)) / dVar6;
}

Assistant:

double Value(const State& state) const {
		const PocmanState& pocstate = static_cast<const PocmanState&>(state);
		return (pocman_->reward_eat_food_ + pocman_->reward_eat_ghost_)
			* (1 - Globals::Discount(pocstate.num_food)) / (1 - Globals::Discount())
			+ pocman_->reward_clear_level_ * Globals::Discount(pocstate.num_food);
	}